

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp.cpp
# Opt level: O0

MPP_RET __thiscall Mpp::decode(Mpp *this,MppPacket packet,MppFrame *frame)

{
  bool bVar1;
  bool bVar2;
  RK_S32 RVar3;
  Mutex *pMVar4;
  MppBuffer pvVar5;
  size_t sVar6;
  MppBuffer buffer_1;
  AutoMutex autoFrameLock_1;
  MppBuffer buffer;
  AutoMutex autoFrameLock;
  MPP_RET ret;
  RK_S32 frm_rdy;
  RK_U32 pkt_done;
  MppFrame *frame_local;
  MppPacket packet_local;
  Mpp *this_local;
  
  bVar1 = false;
  bVar2 = false;
  autoFrameLock.mLock._4_4_ = MPP_OK;
  if (this->mDec == (MppDec)0x0) {
    this_local._4_4_ = MPP_NOK;
  }
  else if (this->mInitDone == 0) {
    this_local._4_4_ = MPP_ERR_INIT;
  }
  else {
    if (this->mOutputTimeout == MPP_POLL_NON_BLOCK) {
      pMVar4 = MppMutexCond::mutex(&this->mFrmOut->super_MppMutexCond);
      Mutex::Autolock::Autolock((Autolock *)&buffer,pMVar4,1);
      RVar3 = mpp_list::list_size(this->mFrmOut);
      if (RVar3 == 0) {
        autoFrameLock_1.mLock._4_4_ = 0;
      }
      else {
        mpp_list::del_at_head(this->mFrmOut,frame,8);
        pvVar5 = mpp_frame_get_buffer(*frame);
        if (pvVar5 != (MppBuffer)0x0) {
          mpp_buffer_sync_begin_f(pvVar5,1,"decode");
        }
        this->mFrameGetCount = this->mFrameGetCount + 1;
        this_local._4_4_ = MPP_OK;
        autoFrameLock_1.mLock._4_4_ = 1;
      }
      Mutex::Autolock::~Autolock((Autolock *)&buffer);
      if (autoFrameLock_1.mLock._4_4_ != 0) {
        return this_local._4_4_;
      }
    }
    do {
      if (!bVar1) {
        autoFrameLock.mLock._4_4_ = mpp_dec_decode(this->mDec,packet);
      }
      if ((packet == (MppPacket)0x0) || (sVar6 = mpp_packet_get_length(packet), sVar6 == 0)) {
        bVar1 = true;
      }
      pMVar4 = MppMutexCond::mutex(&this->mFrmOut->super_MppMutexCond);
      Mutex::Autolock::Autolock((Autolock *)&buffer_1,pMVar4,1);
      RVar3 = mpp_list::list_size(this->mFrmOut);
      if (RVar3 != 0) {
        mpp_list::del_at_head(this->mFrmOut,frame,8);
        pvVar5 = mpp_frame_get_buffer(*frame);
        if (pvVar5 != (MppBuffer)0x0) {
          mpp_buffer_sync_begin_f(pvVar5,1,"decode");
        }
        this->mFrameGetCount = this->mFrameGetCount + 1;
        bVar2 = true;
      }
      Mutex::Autolock::~Autolock((Autolock *)&buffer_1);
      if (autoFrameLock.mLock._4_4_ < MPP_OK) goto LAB_0013a50e;
      if (bVar2) {
        if ((autoFrameLock.mLock._4_4_ < ~MPP_ERR_UNKNOW) &&
           (_mpp_log_l(2,"mpp","Assertion %s failed at %s:%d\n",(char *)0x0,"ret > 0","decode",0x28e
                      ), (mpp_debug & 0x10000000) != 0)) {
          abort();
        }
        autoFrameLock.mLock._4_4_ = MPP_OK;
        goto LAB_0013a50e;
      }
    } while (!bVar1);
    autoFrameLock.mLock._4_4_ = MPP_OK;
LAB_0013a50e:
    this_local._4_4_ = autoFrameLock.mLock._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

MPP_RET Mpp::decode(MppPacket packet, MppFrame *frame)
{
    RK_U32 pkt_done = 0;
    RK_S32 frm_rdy = 0;
    MPP_RET ret = MPP_OK;

    if (!mDec)
        return MPP_NOK;

    if (!mInitDone)
        return MPP_ERR_INIT;

    /*
     * If there is frame to return get the frame first
     * But if the output mode is block then we need to send packet first
     */
    if (!mOutputTimeout) {
        AutoMutex autoFrameLock(mFrmOut->mutex());

        if (mFrmOut->list_size()) {
            MppBuffer buffer;

            mFrmOut->del_at_head(frame, sizeof(*frame));
            buffer = mpp_frame_get_buffer(*frame);
            if (buffer)
                mpp_buffer_sync_ro_begin(buffer);
            mFrameGetCount++;
            return MPP_OK;
        }
    }

    do {
        if (!pkt_done)
            ret = mpp_dec_decode(mDec, packet);

        /* check input packet finished or not */
        if (!packet || !mpp_packet_get_length(packet))
            pkt_done = 1;

        /* always try getting frame */
        {
            AutoMutex autoFrameLock(mFrmOut->mutex());

            if (mFrmOut->list_size()) {
                MppBuffer buffer;

                mFrmOut->del_at_head(frame, sizeof(*frame));
                buffer = mpp_frame_get_buffer(*frame);
                if (buffer)
                    mpp_buffer_sync_ro_begin(buffer);
                mFrameGetCount++;
                frm_rdy = 1;
            }
        }

        /* return on flow error */
        if (ret < 0)
            break;

        /* return on output frame is ready */
        if (frm_rdy) {
            mpp_assert(ret > 0);
            ret = MPP_OK;
            break;
        }

        /* return when packet is send and it is a non-block call */
        if (pkt_done) {
            ret = MPP_OK;
            break;
        }

        /* otherwise continue decoding and getting frame */
    } while (1);

    return ret;
}